

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_substring_reallocationFailed_fn(int _i)

{
  int iVar1;
  AString *pAVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"xxxx01234567xxxx",0x10);
  private_ACUtilsTest_AString_reallocFailCounter = 0;
  private_ACUtilsTest_AString_reallocFail = 1;
  pAVar2 = AString_substring(&string,0,0xffffffffffffffff);
  if (pAVar2 != (AString *)0x0) {
    pcVar6 = (char *)0x0;
    expr = "Assertion \'_ck_x == NULL\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %#x";
    pcVar4 = "(void*) substring == NULL";
    pcVar5 = "(void*) substring";
    iVar1 = 0x9cf;
    goto LAB_0014f02b;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9cf);
  if (string.capacity == 0x10) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9d0);
    if (string.buffer == (char *)0x0) {
      pAVar2 = (AString *)0x0;
      pcVar6 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (string).buffer != NULL";
      pcVar5 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9d0);
      pcVar6 = string.buffer;
      if (string.buffer == (char *)0x0) {
        pAVar2 = (AString *)0x16819b;
        pcVar6 = "(null)";
      }
      else {
        iVar1 = strcmp("xxxx01234567xxxx",string.buffer);
        if (iVar1 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9d0);
          if (string.size != 0x10) {
            pcVar6 = "strlen(\"xxxx01234567xxxx\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).size == strlen(\"xxxx01234567xxxx\")";
            pcVar5 = "(string).size";
            pAVar2 = (AString *)string.size;
            goto LAB_0014eebb;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9d0);
          private_ACUtilsTest_AString_reallocFailCounter = 1;
          private_ACUtilsTest_AString_reallocFail = 1;
          pAVar2 = AString_substring(&string,0,0xffffffffffffffff);
          if (pAVar2 != (AString *)0x0) {
            pcVar6 = (char *)0x0;
            expr = "Assertion \'_ck_x == NULL\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %#x";
            pcVar4 = "(void*) substring == NULL";
            pcVar5 = "(void*) substring";
            iVar1 = 0x9d3;
            goto LAB_0014f02b;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9d3);
          if (string.capacity == 0x10) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9d4);
            if (string.buffer == (char *)0x0) {
              string.size = 0;
              pcVar6 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar4 = "(void*) (string).buffer != NULL";
              pcVar5 = "(void*) (string).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9d4);
              pcVar6 = string.buffer;
              if (string.buffer == (char *)0x0) {
                pcVar6 = "(null)";
                string.size = 0x16819b;
              }
              else {
                iVar1 = strcmp("xxxx01234567xxxx",string.buffer);
                if (iVar1 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9d4);
                  if (string.size == 0x10) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x9d4);
                    (*string.deallocator)(string.buffer);
                    return;
                  }
                  pcVar6 = "strlen(\"xxxx01234567xxxx\")";
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar4 = "(string).size == strlen(\"xxxx01234567xxxx\")";
                  pcVar5 = "(string).size";
                  goto LAB_0014f026;
                }
                string.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar4 = "(string).buffer == (\"xxxx01234567xxxx\")";
              pcVar5 = "(string).buffer";
            }
          }
          else {
            pcVar6 = "(16)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).capacity == (16)";
            pcVar5 = "(string).capacity";
            string.size = string.capacity;
          }
LAB_0014f026:
          iVar1 = 0x9d4;
          pAVar2 = (AString *)string.size;
          goto LAB_0014f02b;
        }
        pAVar2 = (AString *)0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(string).buffer == (\"xxxx01234567xxxx\")";
      pcVar5 = "(string).buffer";
    }
  }
  else {
    pcVar6 = "(16)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(string).capacity == (16)";
    pcVar5 = "(string).capacity";
    pAVar2 = (AString *)string.capacity;
  }
LAB_0014eebb:
  iVar1 = 0x9d0;
LAB_0014f02b:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar4,pcVar5,pAVar2,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_AString_substring_reallocationFailed)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("xxxx01234567xxxx", 16);
    struct AString *substring;
    private_ACUtilsTest_AString_setReallocFail(true, 0);
    substring = AString_substring(&string, 0, -1);
    ACUTILSTEST_ASSERT_PTR_NULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "xxxx01234567xxxx", 16);
    private_ACUtilsTest_AString_setReallocFail(true, 1);
    substring = AString_substring(&string, 0, -1);
    ACUTILSTEST_ASSERT_PTR_NULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "xxxx01234567xxxx", 16);
    private_ACUtilsTest_AString_destructTestString(string);
}